

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<__int128,_fmt::v6::basic_format_specs<char>_>::on_dec
          (int_writer<__int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  undefined1 n [16];
  dec_writer f;
  int num_digits;
  string_view prefix;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  n._8_8_ = in_stack_ffffffffffffffc0;
  n._0_8_ = in_stack_ffffffffffffffb8;
  num_digits = count_digits(*(internal **)&this->abs_value,(uint128_t)n);
  f._20_4_ = uStack_14;
  f.num_digits = num_digits;
  f.abs_value = this->abs_value;
  f._24_8_ = uStack_10;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<__int128,fmt::v6::basic_format_specs<char>>::dec_writer>
            ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
             *this->specs,f);
  return;
}

Assistant:

void on_dec() {
      int num_digits = count_digits(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       dec_writer{abs_value, num_digits});
    }